

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_load(lua_State *L)

{
  int iVar1;
  char *chunkname;
  int iVar2;
  
  chunkname = luaL_optlstring(L,2,"=(load)",(size_t *)0x0);
  iVar2 = 1;
  luaL_checktype(L,1,6);
  lua_settop(L,3);
  iVar1 = lua_load(L,generic_reader,(void *)0x0,chunkname);
  if (iVar1 != 0) {
    lua_pushnil(L);
    lua_insert(L,-2);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

static int luaB_load (lua_State *L) {
  int status;
  const char *cname = luaL_optstring(L, 2, "=(load)");
  luaL_checktype(L, 1, LUA_TFUNCTION);
  lua_settop(L, 3);  /* function, eventual name, plus one reserved slot */
  status = lua_load(L, generic_reader, NULL, cname);
  return load_aux(L, status);
}